

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::M3DImporter::importAnimations(M3DImporter *this,M3DWrapper *m3d)

{
  M3D_INDEX MVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  m3d_t *pmVar7;
  Logger *this_00;
  basic_formatter *this_01;
  ulong uVar8;
  aiAnimation **ppaVar9;
  aiAnimation *this_02;
  aiNodeAnim **ppaVar10;
  aiNodeAnim *this_03;
  ulong uVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  m3dv_t *pmVar14;
  m3dv_t *pmVar15;
  aiQuatKey *local_b00;
  aiVectorKey *local_ad8;
  m3dv_t *q;
  m3dv_t *v;
  string local_a48;
  aiString local_a24;
  undefined4 local_620;
  allocator<char> local_619;
  uint n;
  aiString local_5f4;
  aiAnimation *local_1f0;
  aiAnimation *pAnim;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_60;
  m3da_t *local_40;
  m3da_t *a;
  double t;
  uint ori;
  uint pos;
  uint l;
  uint k;
  uint j;
  uint i;
  M3DWrapper *m3d_local;
  M3DImporter *this_local;
  
  _j = m3d;
  m3d_local = (M3DWrapper *)this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x205,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
  }
  bVar6 = M3DWrapper::operator_cast_to_bool(m3d);
  if (bVar6) {
    pmVar7 = M3DWrapper::operator->(_j);
    this->mScene->mNumAnimations = pmVar7->numaction;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[23]>(&local_1d8,(char (*) [23])"M3D: importAnimations ");
    this_01 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1d8,&this->mScene->mNumAnimations);
    Formatter::basic_formatter::operator_cast_to_string(&local_60,this_01);
    Logger::debug(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1d8);
    pmVar7 = M3DWrapper::operator->(_j);
    if ((pmVar7->numaction != 0) && (pmVar7 = M3DWrapper::operator->(_j), pmVar7->numbone != 0)) {
      pmVar7 = M3DWrapper::operator->(_j);
      auVar4 = ZEXT416(pmVar7->numaction) * ZEXT816(8);
      uVar8 = auVar4._0_8_;
      if (auVar4._8_8_ != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      ppaVar9 = (aiAnimation **)operator_new__(uVar8);
      this->mScene->mAnimations = ppaVar9;
      for (k = 0; uVar5 = k, pmVar7 = M3DWrapper::operator->(_j), uVar5 < pmVar7->numaction;
          k = k + 1) {
        pmVar7 = M3DWrapper::operator->(_j);
        local_40 = pmVar7->action + k;
        this_02 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_02);
        pcVar2 = local_40->name;
        local_1f0 = this_02;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&n,pcVar2,&local_619);
        aiString::aiString(&local_5f4,(string *)&n);
        aiString::operator=(&local_1f0->mName,&local_5f4);
        std::__cxx11::string::~string((string *)&n);
        std::allocator<char>::~allocator(&local_619);
        local_1f0->mDuration = (double)local_40->durationmsec / 10.0;
        local_1f0->mTicksPerSecond = 100.0;
        pmVar7 = M3DWrapper::operator->(_j);
        local_1f0->mNumChannels = pmVar7->numbone;
        auVar4 = ZEXT416(local_1f0->mNumChannels) * ZEXT816(8);
        uVar8 = auVar4._0_8_;
        if (auVar4._8_8_ != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        ppaVar10 = (aiNodeAnim **)operator_new__(uVar8);
        local_1f0->mChannels = ppaVar10;
        for (ori = 0; uVar5 = ori, pmVar7 = M3DWrapper::operator->(_j), uVar5 < pmVar7->numbone;
            ori = ori + 1) {
          this_03 = (aiNodeAnim *)operator_new(0x438);
          aiNodeAnim::aiNodeAnim(this_03);
          local_1f0->mChannels[ori] = this_03;
          pmVar7 = M3DWrapper::operator->(_j);
          pcVar2 = pmVar7->bone[ori].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a48,pcVar2,(allocator<char> *)((long)&v + 7));
          aiString::aiString(&local_a24,&local_a48);
          aiString::operator=(&local_1f0->mChannels[ori]->mNodeName,&local_a24);
          std::__cxx11::string::~string((string *)&local_a48);
          std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
          MVar1 = local_40->numframe;
          local_1f0->mChannels[ori]->mNumRotationKeys = MVar1;
          local_1f0->mChannels[ori]->mNumPositionKeys = MVar1;
          uVar8 = CONCAT44(0,local_40->numframe);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar8;
          uVar11 = SUB168(auVar4 * ZEXT816(0x18),0);
          if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
            uVar11 = 0xffffffffffffffff;
          }
          paVar12 = (aiVectorKey *)operator_new__(uVar11);
          if (uVar8 != 0) {
            local_ad8 = paVar12;
            do {
              aiVectorKey::aiVectorKey(local_ad8);
              local_ad8 = local_ad8 + 1;
            } while (local_ad8 != paVar12 + uVar8);
          }
          local_1f0->mChannels[ori]->mPositionKeys = paVar12;
          uVar8 = CONCAT44(0,local_40->numframe);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar8;
          uVar11 = SUB168(auVar3 * ZEXT816(0x18),0);
          if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
            uVar11 = 0xffffffffffffffff;
          }
          paVar13 = (aiQuatKey *)operator_new__(uVar11);
          if (uVar8 != 0) {
            local_b00 = paVar13;
            do {
              aiQuatKey::aiQuatKey(local_b00);
              local_b00 = local_b00 + 1;
            } while (local_b00 != paVar13 + uVar8);
          }
          local_1f0->mChannels[ori]->mRotationKeys = paVar13;
          pmVar7 = M3DWrapper::operator->(_j);
          t._4_4_ = pmVar7->bone[ori].pos;
          pmVar7 = M3DWrapper::operator->(_j);
          t._0_4_ = pmVar7->bone[ori].ori;
          local_620 = 0;
          for (l = 0; l < local_40->numframe; l = l + 1) {
            a = (m3da_t *)((double)local_40->frame[l].msec / 10.0);
            for (pos = 0; pos < local_40->frame[l].numtransform; pos = pos + 1) {
              if (local_40->frame[l].transform[pos].boneid == ori) {
                t._4_4_ = local_40->frame[l].transform[pos].pos;
                t._0_4_ = local_40->frame[l].transform[pos].ori;
              }
            }
            pmVar7 = M3DWrapper::operator->(_j);
            pmVar14 = pmVar7->vertex + t._4_4_;
            pmVar7 = M3DWrapper::operator->(_j);
            pmVar15 = pmVar7->vertex + t._0_4_;
            local_1f0->mChannels[ori]->mPositionKeys[l].mTime = (double)a;
            local_1f0->mChannels[ori]->mPositionKeys[l].mValue.x = pmVar14->x;
            local_1f0->mChannels[ori]->mPositionKeys[l].mValue.y = pmVar14->y;
            local_1f0->mChannels[ori]->mPositionKeys[l].mValue.z = pmVar14->z;
            local_1f0->mChannels[ori]->mRotationKeys[l].mTime = (double)a;
            local_1f0->mChannels[ori]->mRotationKeys[l].mValue.w = pmVar15->w;
            local_1f0->mChannels[ori]->mRotationKeys[l].mValue.x = pmVar15->x;
            local_1f0->mChannels[ori]->mRotationKeys[l].mValue.y = pmVar15->y;
            local_1f0->mChannels[ori]->mRotationKeys[l].mValue.z = pmVar15->z;
          }
        }
        this->mScene->mAnimations[k] = local_1f0;
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x206,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importAnimations(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, pos, ori;
	double t;
	m3da_t *a;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumAnimations = m3d->numaction;

	ASSIMP_LOG_DEBUG_F("M3D: importAnimations ", mScene->mNumAnimations);

	if (!m3d->numaction || !m3d->numbone)
		return;

	mScene->mAnimations = new aiAnimation *[m3d->numaction];
	for (i = 0; i < m3d->numaction; i++) {
		a = &m3d->action[i];
		aiAnimation *pAnim = new aiAnimation;
		pAnim->mName = aiString(std::string(a->name));
		pAnim->mDuration = ((double)a->durationmsec) / 10;
		pAnim->mTicksPerSecond = 100;
		// now we know how many bones are referenced in this animation
		pAnim->mNumChannels = m3d->numbone;
		pAnim->mChannels = new aiNodeAnim *[pAnim->mNumChannels];
		for (l = 0; l < m3d->numbone; l++) {
			unsigned int n;
			pAnim->mChannels[l] = new aiNodeAnim;
			pAnim->mChannels[l]->mNodeName = aiString(std::string(m3d->bone[l].name));
			// now n is the size of positions / orientations arrays
			pAnim->mChannels[l]->mNumPositionKeys = pAnim->mChannels[l]->mNumRotationKeys = a->numframe;
			pAnim->mChannels[l]->mPositionKeys = new aiVectorKey[a->numframe];
			pAnim->mChannels[l]->mRotationKeys = new aiQuatKey[a->numframe];
			pos = m3d->bone[l].pos;
			ori = m3d->bone[l].ori;
			for (j = n = 0; j < a->numframe; j++) {
				t = ((double)a->frame[j].msec) / 10;
				for (k = 0; k < a->frame[j].numtransform; k++) {
					if (a->frame[j].transform[k].boneid == l) {
						pos = a->frame[j].transform[k].pos;
						ori = a->frame[j].transform[k].ori;
					}
				}
				m3dv_t *v = &m3d->vertex[pos];
				m3dv_t *q = &m3d->vertex[ori];
				pAnim->mChannels[l]->mPositionKeys[j].mTime = t;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.x = v->x;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.y = v->y;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.z = v->z;
				pAnim->mChannels[l]->mRotationKeys[j].mTime = t;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.w = q->w;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.x = q->x;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.y = q->y;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.z = q->z;
			} // foreach frame
		} // foreach bones
		mScene->mAnimations[i] = pAnim;
	}
}